

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O3

int __thiscall booster::aio::acceptor::listen(acceptor *this,int __fd,int __n)

{
  uint uVar1;
  int iVar2;
  system_error *this_00;
  error_code eVar3;
  error_code e;
  uint local_30 [2];
  error_category *local_28;
  
  local_30[0] = 0;
  local_28 = (error_category *)std::_V2::system_category();
  iVar2 = listen(this,__fd,(int)local_30);
  uVar1 = local_30[0];
  if (local_30[0] == 0) {
    return iVar2;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  eVar3._4_4_ = 0;
  eVar3._M_value = uVar1;
  eVar3._M_cat = local_28;
  system::system_error::system_error(this_00,eVar3);
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void acceptor::listen(int backlog)
{
	system::error_code e;
	listen(backlog,e);
	if(e)
		throw system::system_error(e);
}